

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

bool __thiscall
fmt::v8::detail::write_int_localized<fmt::v8::appender,unsigned__int128,char>
          (detail *this,appender *out,unsigned___int128 value,uint prefix,
          basic_format_specs<char> *specs,locale_ref loc)

{
  detail *pdVar1;
  char cVar2;
  undefined1 n [16];
  undefined1 value_00 [16];
  detail dVar3;
  detail *pdVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> bVar8;
  int iVar9;
  char *pcVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  locale_ref in_R9;
  detail *pdVar14;
  uint uVar15;
  ulong size;
  char digits [40];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  undefined8 in_stack_fffffffffffffd38;
  char *pcVar16;
  long local_2b8;
  char local_2b0 [16];
  detail local_2a0;
  basic_format_specs<char> *local_298;
  undefined8 local_290;
  detail local_288 [48];
  anon_class_16_2_3f014a30 local_258;
  undefined1 local_248 [32];
  detail local_228 [504];
  
  local_298 = (basic_format_specs<char> *)loc.locale_;
  local_290 = this;
  thousands_sep_impl<char>((thousands_sep_result<char> *)local_248,in_R9);
  pcVar16 = local_2b0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xfffffffffffffd40,local_248._0_8_,
             (detail *)(local_248._8_8_ + local_248._0_8_));
  local_2a0 = local_228[0];
  if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
    operator_delete((void *)local_248._0_8_);
  }
  dVar3 = local_2a0;
  if (local_2a0 == (detail)0x0) goto LAB_0011808c;
  n._8_8_ = pcVar16;
  n._0_8_ = in_stack_fffffffffffffd38;
  uVar5 = count_digits_fallback<unsigned__int128>((detail *)out,(unsigned___int128)n);
  pcVar10 = pcVar16;
  uVar15 = uVar5;
  uVar6 = uVar5;
  if (local_2b8 == 0) {
LAB_00117f16:
    uVar7 = uVar6;
    uVar11 = uVar15;
    if (pcVar10 == pcVar16 + local_2b8) goto LAB_00117f21;
  }
  else {
    uVar11 = uVar5 + (int)local_2b8;
    lVar12 = local_2b8;
    do {
      cVar2 = *pcVar10;
      uVar7 = uVar6 - (int)cVar2;
      if ((uVar7 == 0 || (int)uVar6 < (int)cVar2) || ((byte)(cVar2 + 0x81U) < 0x82))
      goto LAB_00117f16;
      uVar15 = uVar15 + 1;
      pcVar10 = pcVar10 + 1;
      lVar12 = lVar12 + -1;
      uVar6 = uVar7;
    } while (lVar12 != 0);
LAB_00117f21:
    uVar11 = (int)(uVar7 - 1) / (int)(pcVar16 + local_2b8)[-1] + uVar11;
  }
  value_00._8_8_ = pcVar16;
  value_00._0_8_ = in_stack_fffffffffffffd38;
  format_decimal<char,unsigned__int128>(local_288,(char *)out,(unsigned___int128)value_00,prefix);
  local_248._16_8_ = 0;
  local_248._0_8_ = &PTR_grow_001594c0;
  local_248._8_8_ = local_228;
  local_258.size = (uVar11 + 1) - (uint)((int)specs == 0);
  size = (ulong)(uint)local_258.size;
  local_248._24_8_ = 500;
  if (500 < (uint)local_258.size) {
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow
              ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_248,size);
  }
  pdVar4 = local_290;
  local_248._16_8_ = local_248._24_8_;
  if (size <= (ulong)local_248._24_8_) {
    local_248._16_8_ = size;
  }
  pdVar14 = (detail *)(local_248._8_8_ + (long)local_258.size + -1);
  if (1 < (int)uVar5) {
    uVar13 = (ulong)uVar5 + 1;
    iVar9 = 0;
    pcVar10 = pcVar16;
    do {
      pdVar1 = pdVar14 + -1;
      *pdVar14 = local_288[uVar13 - 2];
      cVar2 = *pcVar10;
      if ('\0' < cVar2) {
        iVar9 = iVar9 + 1;
        if ((cVar2 != '\x7f') && (iVar9 % (int)cVar2 == 0)) {
          if (pcVar10 + 1 != pcVar16 + local_2b8) {
            iVar9 = 0;
            pcVar10 = pcVar10 + 1;
          }
          pdVar14[-1] = local_2a0;
          pdVar1 = pdVar14 + -2;
        }
      }
      pdVar14 = pdVar1;
      uVar13 = uVar13 - 1;
    } while (2 < uVar13);
  }
  *pdVar14 = local_288[0];
  if ((int)specs != 0) {
    pdVar14[-1] = SUB81(specs,0);
  }
  local_258.data = (char *)local_248._8_8_;
  bVar8.container =
       (buffer<char> *)
       write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int_localized<fmt::v8::appender,unsigned__int128,char>(fmt::v8::appender&,unsigned__int128,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_1_>
                 (*(buffer<char> **)local_290,local_298,size,size,&local_258);
  *(buffer<char> **)pdVar4 = bVar8.container;
  if ((detail *)local_248._8_8_ != local_228) {
    operator_delete((void *)local_248._8_8_);
  }
LAB_0011808c:
  if (pcVar16 != local_2b0) {
    operator_delete(pcVar16);
  }
  return dVar3 != (detail)0x0;
}

Assistant:

auto write_int_localized(OutputIt& out, UInt value, unsigned prefix,
                         const basic_format_specs<Char>& specs, locale_ref loc)
    -> bool {
  static_assert(std::is_same<uint64_or_128_t<UInt>, UInt>::value, "");
  const auto sep_size = 1;
  auto ts = thousands_sep<Char>(loc);
  if (!ts.thousands_sep) return false;
  int num_digits = count_digits(value);
  int size = num_digits, n = num_digits;
  const std::string& groups = ts.grouping;
  std::string::const_iterator group = groups.cbegin();
  while (group != groups.cend() && n > *group && *group > 0 &&
         *group != max_value<char>()) {
    size += sep_size;
    n -= *group;
    ++group;
  }
  if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
  char digits[40];
  format_decimal(digits, value, num_digits);
  basic_memory_buffer<Char> buffer;
  if (prefix != 0) ++size;
  const auto usize = to_unsigned(size);
  buffer.resize(usize);
  basic_string_view<Char> s(&ts.thousands_sep, sep_size);
  // Index of a decimal digit with the least significant digit having index 0.
  int digit_index = 0;
  group = groups.cbegin();
  auto p = buffer.data() + size - 1;
  for (int i = num_digits - 1; i > 0; --i) {
    *p-- = static_cast<Char>(digits[i]);
    if (*group <= 0 || ++digit_index % *group != 0 ||
        *group == max_value<char>())
      continue;
    if (group + 1 != groups.cend()) {
      digit_index = 0;
      ++group;
    }
    std::uninitialized_copy(s.data(), s.data() + s.size(),
                            make_checked(p, s.size()));
    p -= s.size();
  }
  *p-- = static_cast<Char>(*digits);
  if (prefix != 0) *p = static_cast<Char>(prefix);
  auto data = buffer.data();
  out = write_padded<align::right>(
      out, specs, usize, usize, [=](reserve_iterator<OutputIt> it) {
        return copy_str<Char>(data, data + size, it);
      });
  return true;
}